

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::DrawXFBStreamInstanced::drawStreamInstanced(DrawXFBStreamInstanced *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 uVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  GLuint color_location;
  GLuint position_location;
  Functions *gl;
  DrawXFBStreamInstanced *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar5 + 0x40))(0x8892,this->m_bo_id_xfb_position);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x191a);
  uVar3 = (**(code **)(lVar5 + 0x780))(this->m_program_id_draw,"position");
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetAttribLocation call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x191d);
  (**(code **)(lVar5 + 0x19f0))(uVar3,4,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribPointer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1920);
  (**(code **)(lVar5 + 0x610))(uVar3);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1923);
  (**(code **)(lVar5 + 0x40))(0x8892,this->m_bo_id_xfb_color);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1926);
  uVar3 = (**(code **)(lVar5 + 0x780))(this->m_program_id_draw,"color");
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glGetAttribLocation call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1929);
  (**(code **)(lVar5 + 0x19f0))(uVar3,4,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribPointer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x192c);
  (**(code **)(lVar5 + 0x610))(uVar3);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glEnableVertexAttribArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x192f);
  (**(code **)(lVar5 + 0x1680))(this->m_program_id_draw);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1932);
  (**(code **)(lVar5 + 0x5c8))(5,this->m_xfb_id,0,4);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1935);
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFBStreamInstanced::drawStreamInstanced()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id_xfb_position);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	glw::GLuint position_location = gl.getAttribLocation(m_program_id_draw, "position");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetAttribLocation call failed.");

	gl.vertexAttribPointer(position_location, 4, GL_FLOAT, GL_FALSE, 0, NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer call failed.");

	gl.enableVertexAttribArray(position_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id_xfb_color);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	glw::GLuint color_location = gl.getAttribLocation(m_program_id_draw, "color");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetAttribLocation call failed.");

	gl.vertexAttribPointer(color_location, 4, GL_FLOAT, GL_FALSE, 0, NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer call failed.");

	gl.enableVertexAttribArray(color_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.useProgram(m_program_id_draw);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.drawTransformFeedbackStreamInstanced(GL_TRIANGLE_STRIP, m_xfb_id, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");
}